

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalGhsMultiGenerator::SetGeneratorPlatform
          (cmGlobalGhsMultiGenerator *this,string *p,cmMakefile *mf)

{
  bool bVar1;
  string *psVar2;
  long lVar3;
  allocator<char> local_b1;
  string bspName;
  string m_2;
  string osdir;
  string platform;
  string arch;
  
  arch._M_dataplus._M_p = (pointer)&arch.field_2;
  arch._M_string_length = 0;
  arch.field_2._M_local_buf[0] = '\0';
  if (p->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&platform,
               "Green Hills MULTI: -A <arch> not specified; defaulting to \"arm\"",
               (allocator<char> *)&osdir);
    cmSystemTools::Message(&platform,(char *)0x0);
    std::__cxx11::string::~string((string *)&platform);
    std::__cxx11::string::assign((char *)&arch);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&platform,"CMAKE_GENERATOR_PLATFORM",(allocator<char> *)&osdir);
    cmMakefile::AddCacheDefinition
              (mf,&platform,arch._M_dataplus._M_p,"Name of generator platform.",INTERNAL,false);
    std::__cxx11::string::~string((string *)&platform);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&arch);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&osdir,"GHS_TARGET_PLATFORM",(allocator<char> *)&bspName);
  psVar2 = cmMakefile::GetSafeDefinition(mf,&osdir);
  std::__cxx11::string::string((string *)&platform,(string *)psVar2);
  std::__cxx11::string::~string((string *)&osdir);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bspName,"GHS_OS_DIR",(allocator<char> *)&m_2);
  psVar2 = cmMakefile::GetSafeDefinition(mf,&bspName);
  std::__cxx11::string::string((string *)&osdir,(string *)psVar2);
  std::__cxx11::string::~string((string *)&bspName);
  bVar1 = cmSystemTools::IsOff(osdir._M_dataplus._M_p);
  if (bVar1) {
    lVar3 = std::__cxx11::string::find((char *)&platform,0x4bf754);
    if (lVar3 != -1) {
      bVar1 = cmake::GetIsInTryCompile((this->super_cmGlobalGenerator).CMakeInstance);
      if (!bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&bspName,
                   "Green Hills MULTI: GHS_OS_DIR not specified; No OS found in \"",
                   (allocator<char> *)&m_2);
        std::__cxx11::string::string<std::allocator<char>>((string *)&m_2,"GHS_OS_ROOT",&local_b1);
        cmMakefile::GetSafeDefinition(mf,&m_2);
        std::__cxx11::string::append((string *)&bspName);
        std::__cxx11::string::~string((string *)&m_2);
        std::__cxx11::string::append((char *)&bspName);
        cmSystemTools::Message(&bspName,(char *)0x0);
        std::__cxx11::string::~string((string *)&bspName);
      }
      std::__cxx11::string::assign((char *)&osdir);
      goto LAB_0029207f;
    }
  }
  bVar1 = cmake::GetIsInTryCompile((this->super_cmGlobalGenerator).CMakeInstance);
  if (!bVar1) {
    bVar1 = cmSystemTools::IsOff(&this->OsDir);
    if (bVar1) {
      bVar1 = cmSystemTools::IsOff(&osdir);
      if (!bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&bspName,"Green Hills MULTI: GHS_OS_DIR not specified; found \"",
                   (allocator<char> *)&m_2);
        std::__cxx11::string::append((string *)&bspName);
        std::__cxx11::string::append((char *)&bspName);
        cmSystemTools::Message(&bspName,(char *)0x0);
        std::__cxx11::string::~string((string *)&bspName);
      }
    }
  }
LAB_0029207f:
  std::__cxx11::string::_M_assign((string *)&this->OsDir);
  std::__cxx11::string::string<std::allocator<char>>((string *)&m_2,"GHS_BSP_NAME",&local_b1);
  psVar2 = cmMakefile::GetSafeDefinition(mf,&m_2);
  std::__cxx11::string::string((string *)&bspName,(string *)psVar2);
  std::__cxx11::string::~string((string *)&m_2);
  bVar1 = cmSystemTools::IsOff(bspName._M_dataplus._M_p);
  if (bVar1) {
    lVar3 = std::__cxx11::string::find((char *)&platform,0x4bf754);
    if (lVar3 != -1) {
      std::operator+(&m_2,"sim",&arch);
      std::__cxx11::string::operator=((string *)&bspName,(string *)&m_2);
      std::__cxx11::string::~string((string *)&m_2);
      std::__cxx11::string::string<std::allocator<char>>((string *)&m_2,"GHS_BSP_NAME",&local_b1);
      cmMakefile::AddCacheDefinition
                (mf,&m_2,bspName._M_dataplus._M_p,"Name of GHS target platform.",STRING,true);
      std::__cxx11::string::~string((string *)&m_2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&m_2,"Green Hills MULTI: GHS_BSP_NAME not specified; defaulting to \"",
                 &local_b1);
      std::__cxx11::string::append((string *)&m_2);
      std::__cxx11::string::append((char *)&m_2);
      cmSystemTools::Message(&m_2,(char *)0x0);
      std::__cxx11::string::~string((string *)&m_2);
    }
  }
  std::__cxx11::string::~string((string *)&bspName);
  std::__cxx11::string::~string((string *)&osdir);
  std::__cxx11::string::~string((string *)&platform);
  std::__cxx11::string::~string((string *)&arch);
  return true;
}

Assistant:

bool cmGlobalGhsMultiGenerator::SetGeneratorPlatform(std::string const& p,
                                                     cmMakefile* mf)
{
  std::string arch;
  if (p.empty()) {
    cmSystemTools::Message(
      "Green Hills MULTI: -A <arch> not specified; defaulting to \"arm\"");
    arch = "arm";

    /* store the platform name for later use
     * -- already done if -A<arch> was specified
     */
    mf->AddCacheDefinition("CMAKE_GENERATOR_PLATFORM", arch.c_str(),
                           "Name of generator platform.",
                           cmStateEnums::INTERNAL);
  } else {
    arch = p;
  }

  /* check if OS location has been updated by platform scripts */
  std::string platform = mf->GetSafeDefinition("GHS_TARGET_PLATFORM");
  std::string osdir = mf->GetSafeDefinition("GHS_OS_DIR");
  if (cmSystemTools::IsOff(osdir.c_str()) &&
      platform.find("integrity") != std::string::npos) {
    if (!this->CMakeInstance->GetIsInTryCompile()) {
      /* required OS location is not found */
      std::string m =
        "Green Hills MULTI: GHS_OS_DIR not specified; No OS found in \"";
      m += mf->GetSafeDefinition("GHS_OS_ROOT");
      m += "\"";
      cmSystemTools::Message(m);
    }
    osdir = "GHS_OS_DIR-NOT-SPECIFIED";
  } else if (!this->CMakeInstance->GetIsInTryCompile() &&
             cmSystemTools::IsOff(this->OsDir) &&
             !cmSystemTools::IsOff(osdir)) {
    /* OS location was updated by auto-selection */
    std::string m = "Green Hills MULTI: GHS_OS_DIR not specified; found \"";
    m += osdir;
    m += "\"";
    cmSystemTools::Message(m);
  }
  this->OsDir = osdir;

  // Determine GHS_BSP_NAME
  std::string bspName = mf->GetSafeDefinition("GHS_BSP_NAME");

  if (cmSystemTools::IsOff(bspName.c_str()) &&
      platform.find("integrity") != std::string::npos) {
    bspName = "sim" + arch;
    /* write back the calculate name for next time */
    mf->AddCacheDefinition("GHS_BSP_NAME", bspName.c_str(),
                           "Name of GHS target platform.",
                           cmStateEnums::STRING, true);
    std::string m =
      "Green Hills MULTI: GHS_BSP_NAME not specified; defaulting to \"";
    m += bspName;
    m += "\"";
    cmSystemTools::Message(m);
  }

  return true;
}